

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FileOptions::SharedDtor(FileOptions *this)

{
  string *psVar1;
  FileOptions *this_local;
  
  if ((this->java_package_ != (string *)internal::kEmptyString_abi_cxx11_) &&
     (psVar1 = this->java_package_, psVar1 != (string *)0x0)) {
    std::__cxx11::string::~string((string *)psVar1);
    operator_delete(psVar1,0x20);
  }
  if ((this->java_outer_classname_ != (string *)internal::kEmptyString_abi_cxx11_) &&
     (psVar1 = this->java_outer_classname_, psVar1 != (string *)0x0)) {
    std::__cxx11::string::~string((string *)psVar1);
    operator_delete(psVar1,0x20);
  }
  if ((this->go_package_ != (string *)internal::kEmptyString_abi_cxx11_) &&
     (psVar1 = this->go_package_, psVar1 != (string *)0x0)) {
    std::__cxx11::string::~string((string *)psVar1);
    operator_delete(psVar1,0x20);
  }
  return;
}

Assistant:

void FileOptions::SharedDtor() {
  if (java_package_ != &::google::protobuf::internal::kEmptyString) {
    delete java_package_;
  }
  if (java_outer_classname_ != &::google::protobuf::internal::kEmptyString) {
    delete java_outer_classname_;
  }
  if (go_package_ != &::google::protobuf::internal::kEmptyString) {
    delete go_package_;
  }
  if (this != default_instance_) {
  }
}